

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O3

void __thiscall
FastPForLib::SIMDSimplePFor<FastPForLib::Simple8b<true>_>::__encodeArray
          (SIMDSimplePFor<FastPForLib::Simple8b<true>_> *this,uint32_t *in,size_t length,
          uint32_t *out,size_t *nvalue)

{
  ulong uVar1;
  pointer puVar2;
  iterator __position;
  uint32_t *in_00;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  byte *pbVar6;
  ulong uVar7;
  byte *__src;
  uint32_t k;
  long lVar8;
  __m128i *out_00;
  uint32_t *puVar9;
  ulong __n;
  uint8_t bestb;
  uint8_t bestcexcept;
  uint8_t maxb;
  size_t outcap;
  byte local_67;
  byte local_66;
  uint8_t local_65;
  uint local_64;
  uint32_t *local_60;
  size_t *local_58;
  uint32_t *local_50;
  __m128i *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  size_t local_38;
  
  local_58 = nvalue;
  checkifdivisibleby(length,0x80);
  puVar2 = (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar2) {
    (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  pbVar6 = (this->bytescontainer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  out_00 = (__m128i *)(out + 1);
  __src = pbVar6;
  if (0x7f < (long)length) {
    local_50 = in + length;
    local_40 = &this->datatobepacked;
    puVar9 = in + 0x80;
    local_60 = out;
    do {
      getBestBFromData(this,in,&local_67,&local_66,&local_65);
      bVar3 = local_67;
      *pbVar6 = local_67;
      pbVar6[1] = local_66;
      pbVar6 = pbVar6 + 2;
      if (local_66 != 0) {
        lVar8 = 0;
        local_48 = out_00;
        do {
          if (in[lVar8] >> (bVar3 & 0x1f) != 0) {
            local_64 = in[lVar8] >> (local_67 & 0x1f);
            __position._M_current =
                 (this->datatobepacked).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->datatobepacked).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(local_40,__position,&local_64);
            }
            else {
              *__position._M_current = local_64;
              (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            *pbVar6 = (byte)lVar8;
            pbVar6 = pbVar6 + 1;
          }
          lVar8 = lVar8 + 1;
          out_00 = local_48;
        } while (lVar8 != 0x80);
      }
      usimdpack(in,out_00,(uint)local_67);
      out_00 = out_00 + local_67;
      puVar9 = puVar9 + 0x80;
      in = in + 0x80;
    } while (puVar9 <= local_50);
    out = local_60;
    __src = (this->bytescontainer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            ._M_impl.super__Vector_impl_data._M_start;
  }
  uVar5 = (int)pbVar6 - (int)__src;
  puVar9 = (uint32_t *)((long)*out_00 + 4);
  __n = (ulong)uVar5;
  *out = (uint32_t)((ulong)((long)out_00 - (long)out) >> 2);
  *(uint *)*out_00 = uVar5;
  memcpy(puVar9,__src,__n);
  uVar7 = __n + 3 & 0xfffffffffffffffc;
  if (__n < uVar7) {
    uVar1 = (long)*out_00 + __n + 5;
    uVar4 = (long)*out_00 + uVar7 + 4;
    if (uVar4 < uVar1) {
      uVar4 = uVar1;
    }
    memset((void *)((long)puVar9 + __n),0,(uVar4 - ((long)*out_00 + __n)) - 4);
  }
  local_38 = 0;
  in_00 = (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start;
  Simple8b<true>::encodeArray
            (&this->ecoder,in_00,
             (long)(this->datatobepacked).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)in_00 >> 2,
             (uint32_t *)((long)puVar9 + uVar7),&local_38);
  *local_58 = (long)((long)((long)puVar9 + uVar7) + (local_38 * 4 - (long)out)) >> 2;
  return;
}

Assistant:

void __encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                     size_t &nvalue) {
    uint32_t *const initout = out; // keep track of this
    checkifdivisibleby(length, BlockSize);
    uint32_t *const headerout = out++; // keep track of this
    datatobepacked.clear();
    uint8_t *bc = &bytescontainer[0];
    for (const uint32_t *const final = in + length; (in + BlockSize <= final);
         in += BlockSize) {
      uint8_t bestb, bestcexcept, maxb;
      getBestBFromData(in, bestb, bestcexcept, maxb);
      *bc++ = bestb;
      *bc++ = bestcexcept;
      if (bestcexcept > 0) {
        assert(bestb < 32);
        const uint32_t maxval = 1U << bestb;
        for (uint32_t k = 0; k < BlockSize; ++k) {
          if (in[k] >= maxval) {
            datatobepacked.push_back(in[k] >> bestb);
            *bc++ = static_cast<uint8_t>(k);
          }
        }
      }
      assert(BlockSize == 128);
      usimdpack(in, reinterpret_cast<__m128i *>(out), bestb);
      out += BlockSizeInUnitsOfPackSize * bestb;
      // out = packblockup<BlockSize>(in, out, bestb);
    }
    headerout[0] = static_cast<uint32_t>(out - headerout);
    const uint32_t bytescontainersize =
        static_cast<uint32_t>(bc - &bytescontainer[0]);
    *(out++) = bytescontainersize;
    memcpy(out, &bytescontainer[0], bytescontainersize);
    uint8_t* pad8 = (uint8_t*)out + bytescontainersize;
    out += (bytescontainersize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    while (pad8 < (uint8_t*)out)
        *pad8++ = 0; // clear padding bytes

    size_t outcap = 0;
    ecoder.encodeArray(datatobepacked.data(), datatobepacked.size(), out,
                       outcap);
    out += outcap;
    nvalue = out - initout;
  }